

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_checksum.cpp
# Opt level: O0

uint lzham::crc32(uint crc,lzham_uint8 *ptr,size_t buf_len)

{
  uint uVar1;
  lzham_uint8 b;
  size_t buf_len_local;
  lzham_uint8 *ptr_local;
  uint crc_local;
  uint local_4;
  
  if (ptr == (lzham_uint8 *)0x0) {
    local_4 = 0;
  }
  else {
    crc_local = crc ^ 0xffffffff;
    buf_len_local = buf_len;
    ptr_local = ptr;
    while (buf_len_local != 0) {
      uVar1 = crc_local >> 4 ^ *(uint *)(s_crc32 + (ulong)(crc_local & 0xf ^ *ptr_local & 0xf) * 4);
      crc_local = uVar1 >> 4 ^
                  *(uint *)(s_crc32 + (ulong)(uVar1 & 0xf ^ (int)(uint)*ptr_local >> 4) * 4);
      buf_len_local = buf_len_local - 1;
      ptr_local = ptr_local + 1;
    }
    local_4 = crc_local ^ 0xffffffff;
  }
  return local_4;
}

Assistant:

uint crc32(uint crc, const lzham_uint8 *ptr, size_t buf_len)
   {
      if (!ptr) 
         return cInitCRC32;

      crc = ~crc; 
      while (buf_len--) 
      { 
         lzham_uint8 b = *ptr++; 
         crc = (crc >> 4) ^ s_crc32[(crc & 0xF) ^ (b & 0xF)]; 
         crc = (crc >> 4) ^ s_crc32[(crc & 0xF) ^ (b >> 4)]; 
      }
      return ~crc;
   }